

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O2

errr finish_parse_names(parser *p)

{
  long *plVar1;
  long *plVar2;
  void *p_00;
  char **ppcVar3;
  ulong uVar4;
  ulong uVar5;
  long *plVar6;
  long lVar7;
  
  p_00 = parser_priv(p);
  name_sections = (char ***)mem_zalloc(0x18);
  for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
    ppcVar3 = (char **)mem_alloc((ulong)(*(int *)((long)p_00 + lVar7 * 4 + 4) + 1) << 3);
    name_sections[lVar7] = ppcVar3;
    plVar1 = (long *)((long)p_00 + lVar7 * 8 + 0x10);
    uVar4 = (ulong)*(uint *)((long)p_00 + lVar7 * 4 + 4);
    plVar6 = plVar1;
    for (uVar5 = 0; (plVar6 = (long *)*plVar6, plVar6 != (long *)0x0 && (uVar5 < uVar4));
        uVar5 = uVar5 + 1) {
      name_sections[lVar7][uVar5] = (char *)plVar6[1];
    }
    name_sections[lVar7][uVar4] = (char *)0x0;
    plVar6 = (long *)*plVar1;
    while (plVar6 != (long *)0x0) {
      plVar2 = (long *)*plVar6;
      mem_free(plVar6);
      *plVar1 = (long)plVar2;
      plVar6 = plVar2;
    }
  }
  mem_free(p_00);
  parser_destroy(p);
  return 0;
}

Assistant:

static errr finish_parse_names(struct parser *p) {
	int i;
	unsigned int j;
	struct names_parse *n = parser_priv(p);
	struct name *nm;
	name_sections = mem_zalloc(sizeof(char**) * RANDNAME_NUM_TYPES);
	for (i = 0; i < RANDNAME_NUM_TYPES; i++) {
		name_sections[i] = mem_alloc(sizeof(char*) * (n->nnames[i] + 1));
		for (nm = n->names[i], j = 0; nm && j < n->nnames[i]; nm = nm->next, j++) {
			name_sections[i][j] = nm->str;
		}
		name_sections[i][n->nnames[i]] = NULL;
		while (n->names[i]) {
			nm = n->names[i]->next;
			mem_free(n->names[i]);
			n->names[i] = nm;
		}
	}
	mem_free(n);
	parser_destroy(p);
	return 0;
}